

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_node_copy(fy_document *fyd,fy_node *fyn_from)

{
  undefined1 *puVar1;
  fy_node *pfVar2;
  
  if (fyd != (fy_document *)0x0) {
    pfVar2 = fy_node_copy_internal(fyd,fyn_from,(fy_node *)0x0);
    if (pfVar2 == (fy_node *)0x0) {
      puVar1 = &fyd->diag->field_0x3c;
      *puVar1 = *puVar1 & 0xfe;
      pfVar2 = (fy_node *)0x0;
    }
    return pfVar2;
  }
  return (fy_node *)0x0;
}

Assistant:

struct fy_node *fy_node_copy(struct fy_document *fyd, struct fy_node *fyn_from) {
    struct fy_node *fyn;

    if (!fyd)
        return NULL;

    fyn = fy_node_copy_internal(fyd, fyn_from, NULL);
    if (!fyn) {
        fyd->diag->on_error = false;
        return NULL;
    }

    return fyn;
}